

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O2

void google::protobuf::StrAppend(string *result,AlphaNum *a,AlphaNum *b)

{
  LogMessage *pLVar1;
  pointer pcVar2;
  char *pcVar3;
  size_type sVar4;
  LogFinisher local_61;
  LogMessage local_60;
  
  pcVar2 = (result->_M_dataplus)._M_p;
  sVar4 = result->_M_string_length;
  if ((ulong)((long)a->piece_data_ - (long)pcVar2) <= sVar4) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/stubs/strutil.cc"
               ,0x62b);
    pLVar1 = internal::LogMessage::operator<<
                       (&local_60,
                        "CHECK failed: (uintptr_t((a).data() - (*result).data())) > (uintptr_t((*result).size())): "
                       );
    internal::LogFinisher::operator=(&local_61,pLVar1);
    internal::LogMessage::~LogMessage(&local_60);
    pcVar2 = (result->_M_dataplus)._M_p;
    sVar4 = result->_M_string_length;
  }
  if ((ulong)((long)b->piece_data_ - (long)pcVar2) <= sVar4) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/stubs/strutil.cc"
               ,0x62c);
    pLVar1 = internal::LogMessage::operator<<
                       (&local_60,
                        "CHECK failed: (uintptr_t((b).data() - (*result).data())) > (uintptr_t((*result).size())): "
                       );
    internal::LogFinisher::operator=(&local_61,pLVar1);
    internal::LogMessage::~LogMessage(&local_60);
    sVar4 = result->_M_string_length;
  }
  std::__cxx11::string::resize((ulong)result);
  pcVar2 = (result->_M_dataplus)._M_p;
  pcVar3 = Append2(pcVar2 + sVar4,a,b);
  if (pcVar3 != pcVar2 + result->_M_string_length) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/stubs/strutil.cc"
               ,0x631);
    pLVar1 = internal::LogMessage::operator<<
                       (&local_60,"CHECK failed: (out) == (begin + result->size()): ");
    internal::LogFinisher::operator=(&local_61,pLVar1);
    internal::LogMessage::~LogMessage(&local_60);
  }
  return;
}

Assistant:

void StrAppend(std::string *result, const AlphaNum &a, const AlphaNum &b) {
  GOOGLE_DCHECK_NO_OVERLAP(*result, a);
  GOOGLE_DCHECK_NO_OVERLAP(*result, b);
  std::string::size_type old_size = result->size();
  result->resize(old_size + a.size() + b.size());
  char *const begin = &*result->begin();
  char *out = Append2(begin + old_size, a, b);
  GOOGLE_DCHECK_EQ(out, begin + result->size());
}